

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

int64_t aom_get_sse_plane(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,int plane,int highbd)

{
  int64_t iVar1;
  
  if (highbd == 0) {
    if (plane == 2) {
      iVar1 = get_sse((a->field_5).field_0.v_buffer,(a->field_4).field_0.uv_stride,
                      (b->field_5).field_0.v_buffer,(b->field_4).field_0.uv_stride,
                      (a->field_2).field_0.uv_crop_width,(a->field_3).field_0.uv_crop_height);
      return iVar1;
    }
    if (plane == 1) {
      iVar1 = get_sse((a->field_5).field_0.u_buffer,(a->field_4).field_0.uv_stride,
                      (b->field_5).field_0.u_buffer,(b->field_4).field_0.uv_stride,
                      (a->field_2).field_0.uv_crop_width,(a->field_3).field_0.uv_crop_height);
      return iVar1;
    }
    if (plane == 0) {
      iVar1 = get_sse((a->field_5).field_0.y_buffer,(a->field_4).field_0.y_stride,
                      (b->field_5).field_0.y_buffer,(b->field_4).field_0.y_stride,
                      (a->field_2).field_0.y_crop_width,(a->field_3).field_0.y_crop_height);
      return iVar1;
    }
  }
  else {
    if (plane == 2) {
      iVar1 = highbd_get_sse((a->field_5).field_0.v_buffer,(a->field_4).field_0.uv_stride,
                             (b->field_5).field_0.v_buffer,(b->field_4).field_0.uv_stride,
                             (a->field_2).field_0.uv_crop_width,(a->field_3).field_0.uv_crop_height)
      ;
      return iVar1;
    }
    if (plane == 1) {
      iVar1 = highbd_get_sse((a->field_5).field_0.u_buffer,(a->field_4).field_0.uv_stride,
                             (b->field_5).field_0.u_buffer,(b->field_4).field_0.uv_stride,
                             (a->field_2).field_0.uv_crop_width,(a->field_3).field_0.uv_crop_height)
      ;
      return iVar1;
    }
    if (plane == 0) {
      iVar1 = aom_highbd_get_y_sse(a,b);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int64_t aom_get_sse_plane(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, int plane, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    switch (plane) {
      case 0: return aom_highbd_get_y_sse(a, b);
      case 1: return aom_highbd_get_u_sse(a, b);
      case 2: return aom_highbd_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  } else {
    switch (plane) {
      case 0: return aom_get_y_sse(a, b);
      case 1: return aom_get_u_sse(a, b);
      case 2: return aom_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  }
#else
  (void)highbd;
  switch (plane) {
    case 0: return aom_get_y_sse(a, b);
    case 1: return aom_get_u_sse(a, b);
    case 2: return aom_get_v_sse(a, b);
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
#endif
}